

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_unpk_16_mm(void)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) != 0) {
    uVar1 = OPER_AY_PD_8();
    uVar2 = m68ki_read_imm_16();
    uVar4 = ((uVar1 & 0xf0) << 4 | uVar1 & 0xf) + uVar2;
    uVar3 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
    uVar1 = *(int *)((long)m68ki_cpu.dar + uVar3 + 0x20) - 1;
    *(uint *)((long)m68ki_cpu.dar + uVar3 + 0x20) = uVar1;
    m68ki_write_8_fc(uVar1,m68ki_cpu.s_flag | 1,uVar4 >> 8 & 0xff);
    uVar3 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
    uVar1 = *(int *)((long)m68ki_cpu.dar + uVar3 + 0x20) - 1;
    *(uint *)((long)m68ki_cpu.dar + uVar3 + 0x20) = uVar1;
    m68ki_write_8_fc(uVar1,m68ki_cpu.s_flag | 1,uVar4 & 0xff);
    return;
  }
  m68ki_exception_illegal();
  return;
}

Assistant:

static void m68k_op_unpk_16_mm(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		/* Note: AX and AY are reversed in Motorola's docs */
		uint src = OPER_AY_PD_8();
		uint ea_dst;

		src = (((src << 4) & 0x0f00) | (src & 0x000f)) + OPER_I_16();
		ea_dst = EA_AX_PD_8();
		m68ki_write_8(ea_dst, (src >> 8) & 0xff);
		ea_dst = EA_AX_PD_8();
		m68ki_write_8(ea_dst, src & 0xff);
		return;
	}
	m68ki_exception_illegal();
}